

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O2

void __thiscall BrokerSendMessage_SinglePart_Test::TestBody(BrokerSendMessage_SinglePart_Test *this)

{
  uint32_t mid;
  TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *this_00;
  ReturnAction<bool> RStack_2f8;
  MatcherBase<const_pstore::brokerface::message_type_&> local_2e8;
  MockSpec<bool_(const_pstore::brokerface::message_type_&)> local_2d0;
  Action<bool_(const_pstore::brokerface::message_type_&)> local_2b0;
  mock_writer wr;
  EqMatcher<pstore::brokerface::message_type> local_208;
  message_type expected;
  
  anon_unknown.dwarf_4131e::mock_writer::mock_writer(&wr);
  mid = (this->super_BrokerSendMessage).message_id_;
  std::__cxx11::string::string((string *)&local_208,"hello world",(allocator *)&local_2d0);
  pstore::brokerface::message_type::message_type(&expected,mid,0,1,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  memcpy(&local_208,&expected,0x100);
  testing::Matcher<pstore::brokerface::message_type_const&>::
  Matcher<testing::internal::EqMatcher<pstore::brokerface::message_type>,void>
            ((Matcher<pstore::brokerface::message_type_const&> *)&local_2e8,&local_208);
  anon_unknown.dwarf_4131e::mock_writer::gmock_write_impl
            (&local_2d0,&wr,(Matcher<const_pstore::brokerface::message_type_&> *)&local_2e8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
            InternalExpectedAt(&local_2d0,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                               ,0x39,"wr","write_impl (Eq (expected))");
  testing::internal::ReturnAction<bool>::ReturnAction(&RStack_2f8,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_2b0,(ReturnAction *)&RStack_2f8);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (this_00,&local_2b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_2f8.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::message_type_&> *)&local_2d0.matchers_);
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase(&local_2e8)
  ;
  pstore::brokerface::send_message(&wr.super_writer,true,"hello","world");
  anon_unknown.dwarf_4131e::mock_writer::~mock_writer(&wr);
  return;
}

Assistant:

TEST_F (BrokerSendMessage, SinglePart) {
    using ::testing::Eq;
    using ::testing::Return;

    mock_writer wr;
    pstore::brokerface::message_type const expected{message_id_, 0, 1, "hello world"};
    EXPECT_CALL (wr, write_impl (Eq (expected))).WillOnce (Return (true));

    pstore::brokerface::send_message (wr, true /*error on timeout*/, "hello", "world");
}